

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTestFilters(ConsoleReporter *this)

{
  bool bVar1;
  element_type *peVar2;
  ostream *poVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  Colour guard;
  Code in_stack_ffffffffffffff9c;
  Colour *in_stack_ffffffffffffffa0;
  string local_40 [56];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *container;
  
  container = in_RDI;
  peVar2 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x14014c);
  (*(peVar2->super_NonCopyable)._vptr_NonCopyable[0xd])();
  bVar1 = TestSpec::hasFilters((TestSpec *)0x14015d);
  if (bVar1) {
    Colour::Colour(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    poVar3 = std::operator<<((ostream *)
                             in_RDI[1].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,"Filters: ");
    peVar2 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x14019f);
    (*(peVar2->super_NonCopyable)._vptr_NonCopyable[0xf])();
    serializeFilters(container);
    poVar3 = std::operator<<(poVar3,local_40);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string(local_40);
    Colour::~Colour((Colour *)0x1401fe);
  }
  return;
}

Assistant:

void ConsoleReporter::printTestFilters() {
    if (m_config->testSpec().hasFilters()) {
        Colour guard(Colour::BrightYellow);
        stream << "Filters: " << serializeFilters(m_config->getTestsOrTags()) << '\n';
    }
}